

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString * regionTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  UINT8 type_local;
  
  switch(type) {
  case '\0':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Descriptor");
    break;
  case '\x01':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"BIOS");
    break;
  case '\x02':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"ME");
    break;
  case '\x03':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"GbE");
    break;
  case '\x04':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PDR");
    break;
  case '\x05':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"DevExp1");
    break;
  case '\x06':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"BIOS2");
    break;
  case '\a':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Microcode");
    break;
  case '\b':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"EC");
    break;
  case '\t':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"DevExp2");
    break;
  case '\n':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"IE");
    break;
  case '\v':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"10GbE1");
    break;
  case '\f':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"10GbE2");
    break;
  case '\r':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Reserved1");
    break;
  case '\x0e':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Reserved2");
    break;
  case '\x0f':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PTT");
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)type);
  }
  return __return_storage_ptr__;
}

Assistant:

UString regionTypeToUString(const UINT8 type)
{
    switch (type) {
        case Subtypes::DescriptorRegion:  return UString("Descriptor");
        case Subtypes::BiosRegion:        return UString("BIOS");
        case Subtypes::MeRegion:          return UString("ME");
        case Subtypes::GbeRegion:         return UString("GbE");
        case Subtypes::PdrRegion:         return UString("PDR");
        case Subtypes::DevExp1Region:     return UString("DevExp1");
        case Subtypes::Bios2Region:       return UString("BIOS2");
        case Subtypes::MicrocodeRegion:   return UString("Microcode");
        case Subtypes::EcRegion:          return UString("EC");
        case Subtypes::DevExp2Region:     return UString("DevExp2");
        case Subtypes::IeRegion:          return UString("IE");
        case Subtypes::Tgbe1Region:       return UString("10GbE1");
        case Subtypes::Tgbe2Region:       return UString("10GbE2");
        case Subtypes::Reserved1Region:   return UString("Reserved1");
        case Subtypes::Reserved2Region:   return UString("Reserved2");
        case Subtypes::PttRegion:         return UString("PTT");
    };
    
    return  usprintf("Unknown %02Xh", type);
}